

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

ssize_t bgzf_raw_write(BGZF *fp,void *data,size_t length)

{
  ssize_t sVar1;
  
  sVar1 = hwrite(fp->fp,data,length);
  return sVar1;
}

Assistant:

ssize_t bgzf_raw_write(BGZF *fp, const void *data, size_t length)
{
    return hwrite(fp->fp, data, length);
}